

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::MakeObj(VirtualMachine *this)

{
  size_t sVar1;
  element_type *peVar2;
  size_type sVar3;
  const_reference this_00;
  unordered_map<std::__cxx11::string,runtime::Variable,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,runtime::Variable>>>
  *this_01;
  string *__n;
  Variable VVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>
  local_b0;
  undefined1 local_80 [8];
  Variable value;
  string *key;
  size_t i;
  Object *ret;
  value_type *objProto;
  allocator<char> local_39;
  string local_38;
  size_t local_18;
  size_t objIndex;
  VirtualMachine *this_local;
  
  objIndex = (size_t)this;
  sVar1 = getByteCodeParameter(this);
  local_18 = sVar1;
  peVar2 = std::
           __shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->file);
  sVar3 = std::vector<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>::
          size(&peVar2->objects);
  if (sVar3 <= sVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Index out of bounds in MakeObj",&local_39);
    panic(this,&local_38);
  }
  peVar2 = std::
           __shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->file);
  this_00 = std::vector<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>::
            at(&peVar2->objects,local_18);
  this_01 = (unordered_map<std::__cxx11::string,runtime::Variable,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,runtime::Variable>>>
             *)Heap::NewObject(&this->heap);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>_>_>
  ::clear((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>_>_>
           *)this_01);
  key = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::size(&this_00->keys);
  while (__n = (string *)((long)&key[-1].field_2._M_allocated_capacity + 0xf), key != (string *)0x0)
  {
    value.field_1.objectValue =
         (Object *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::at(&this_00->keys,(size_type)__n);
    VVar4 = popOpStack(this);
    value._0_8_ = VVar4.field_1;
    local_80._0_4_ = VVar4.type;
    std::make_pair<std::__cxx11::string_const&,runtime::Variable_const&>
              (&local_b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               value.field_1.objectValue,(Variable *)local_80);
    std::
    unordered_map<std::__cxx11::string,runtime::Variable,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,runtime::Variable>>>
    ::insert<std::pair<std::__cxx11::string,runtime::Variable>>(this_01,&local_b0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>
    ::~pair(&local_b0);
    key = __n;
  }
  pushObject(this,(Object *)this_01);
  advance(this);
  return;
}

Assistant:

void runtime::VirtualMachine::MakeObj() {

  std::size_t objIndex = this->getByteCodeParameter();

  if (objIndex >= this->file->objects.size()) {
    this->panic("Index out of bounds in MakeObj");
    return;
  }

  const auto& objProto = this->file->objects.at(objIndex);

  auto ret = this->heap.NewObject();
  ret->properties.clear();

  for (std::size_t i = objProto.keys.size(); i-- > 0;) {
    const std::string & key = objProto.keys.at(i);
    const Variable value = this->popOpStack();
    ret->properties.insert(std::make_pair(key, value));
  }

  this->pushObject(ret);
  this->advance();
}